

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<double> *paVar1;
  double dVar2;
  initializer_list<double> __l;
  bool bVar3;
  ostream *poVar4;
  void *pvVar5;
  reference pdVar6;
  allocator local_1079;
  string local_1078 [32];
  Polynomial<double> local_1058;
  Polynomial<double> local_1030;
  TransferFunction<double> local_1008;
  undefined1 local_fb0 [8];
  Filter<double> maFilter;
  value_type_conflict local_f08;
  undefined1 local_f00 [8];
  vector<double,_std::allocator<double>_> aMa;
  value_type_conflict local_ee0;
  undefined1 local_ed8 [8];
  vector<double,_std::allocator<double>_> bMa;
  string local_eb8 [32];
  undefined1 local_e98 [8];
  StateSpaceFilter<double> ssfiler;
  string local_e70 [32];
  undefined1 local_e50 [8];
  Filter<double> emptyFilter;
  double t;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  ofstream outF;
  allocator<double> local_b89;
  double local_b88 [12];
  iterator local_b28;
  size_type local_b20;
  undefined1 local_b18 [8];
  vector<double,_std::allocator<double>_> times;
  StateSpaceFilter<double> ssFilter;
  string local_ad8 [32];
  undefined1 local_ab8 [8];
  Filter<double> filterLowPass6th;
  string local_a10 [32];
  undefined1 local_9f0 [8];
  Filter<double> filterLowPass2nd;
  string local_948 [32];
  undefined1 local_928 [8];
  TransferFunction<double> lowPass6th;
  string local_8c8 [32];
  undefined1 local_8a8 [8];
  TransferFunction<double> lowPass2nd;
  initializer_list<std::complex<double>_> local_840;
  Polynomial<double> local_830;
  TransferFunction<double> local_808;
  TransferFunction<double> local_7b0;
  TransferFunction<double> local_758;
  TransferFunction<double> local_700;
  TransferFunction<double> local_6a8;
  TransferFunction<double> local_650;
  Polynomial<double> local_5f8;
  Polynomial<double> local_5d0;
  Polynomial<double> local_5a8;
  Polynomial<double> local_580;
  Polynomial<double> local_558;
  Polynomial<double> local_530;
  Polynomial<double> local_508;
  Polynomial<double> local_4e0;
  complex<double> local_4b8;
  initializer_list<std::complex<double>_> local_4a8;
  Polynomial<double> local_498;
  Polynomial<double> local_470;
  complex<double> local_448;
  initializer_list<std::complex<double>_> local_438;
  Polynomial<double> local_428;
  Polynomial<double> local_400;
  complex<double> local_3d8;
  initializer_list<std::complex<double>_> local_3c8;
  Polynomial<double> local_3b8;
  Polynomial<double> local_390;
  complex<double> local_368;
  initializer_list<std::complex<double>_> local_358;
  Polynomial<double> local_348;
  Polynomial<double> local_320;
  double local_2f8;
  initializer_list<double> local_2f0;
  Polynomial<double> local_2e0;
  Polynomial<double> local_2b8;
  double local_290;
  initializer_list<double> local_288;
  Polynomial<double> local_278;
  Polynomial<double> local_250;
  double local_228;
  initializer_list<double> local_220;
  Polynomial<double> local_210;
  Polynomial<double> local_1e8;
  double local_1c0;
  initializer_list<double> local_1b8;
  Polynomial<double> local_1a8;
  Polynomial<double> local_180;
  double local_158;
  initializer_list<double> local_150;
  undefined1 local_140 [8];
  Polynomial<double> p4;
  initializer_list<double> local_f0;
  undefined1 local_e0 [8];
  Polynomial<double> p3;
  double local_a8 [3];
  initializer_list<double> local_90;
  undefined1 local_80 [8];
  Polynomial<double> p2;
  initializer_list<double> local_48;
  undefined1 local_38 [8];
  Polynomial<double> p1;
  
  p1.size_._4_4_ = 0;
  poVar4 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|        TEST #1         |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|       Polynomial       |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  p2.size_ = 0x3ff0000000000000;
  local_48._M_array = (iterator)&p2.size_;
  local_48._M_len = 2;
  rtb::Filter::Polynomial<double>::Polynomial((Polynomial<double> *)local_38,&local_48);
  local_a8[0] = 1.0;
  local_a8[1] = -2.0;
  local_a8[2] = 0.0;
  local_90._M_array = local_a8;
  local_90._M_len = 3;
  rtb::Filter::Polynomial<double>::Polynomial((Polynomial<double> *)local_80,&local_90);
  p4.size_ = 0;
  local_f0._M_array = (iterator)&p4.size_;
  local_f0._M_len = 4;
  rtb::Filter::Polynomial<double>::Polynomial((Polynomial<double> *)local_e0,&local_f0);
  local_158 = 5.0;
  local_150._M_array = &local_158;
  local_150._M_len = 1;
  rtb::Filter::Polynomial<double>::Polynomial((Polynomial<double> *)local_140,&local_150);
  poVar4 = std::operator<<((ostream *)&std::cout,"p1 =");
  rtb::Filter::operator<<(poVar4,(Polynomial<double> *)local_38);
  poVar4 = std::operator<<((ostream *)&std::cout,"p2 =");
  rtb::Filter::operator<<(poVar4,(Polynomial<double> *)local_80);
  poVar4 = std::operator<<((ostream *)&std::cout,"p3 =");
  rtb::Filter::operator<<(poVar4,(Polynomial<double> *)local_e0);
  poVar4 = std::operator<<((ostream *)&std::cout,"p4 =");
  rtb::Filter::operator<<(poVar4,(Polynomial<double> *)local_140);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Scalar Multiplication");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"p1 * 2 = ");
  local_1c0 = 2.0;
  local_1b8._M_array = &local_1c0;
  local_1b8._M_len = 1;
  rtb::Filter::Polynomial<double>::Polynomial(&local_1a8,&local_1b8);
  rtb::Filter::multiply<double>(&local_180,(Polynomial<double> *)local_38,&local_1a8);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_180);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_180);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_1a8);
  poVar4 = std::operator<<((ostream *)&std::cout,"p2 * 3 = ");
  local_228 = 3.0;
  local_220._M_array = &local_228;
  local_220._M_len = 1;
  rtb::Filter::Polynomial<double>::Polynomial(&local_210,&local_220);
  rtb::Filter::multiply<double>(&local_1e8,(Polynomial<double> *)local_80,&local_210);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_1e8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_1e8);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_210);
  poVar4 = std::operator<<((ostream *)&std::cout,"p3 * 4 = ");
  local_290 = 4.0;
  local_288._M_array = &local_290;
  local_288._M_len = 1;
  rtb::Filter::Polynomial<double>::Polynomial(&local_278,&local_288);
  rtb::Filter::multiply<double>(&local_250,(Polynomial<double> *)local_e0,&local_278);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_250);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_250);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_278);
  poVar4 = std::operator<<((ostream *)&std::cout,"p4 * 5 = ");
  local_2f8 = 5.0;
  local_2f0._M_array = &local_2f8;
  local_2f0._M_len = 1;
  rtb::Filter::Polynomial<double>::Polynomial(&local_2e0,&local_2f0);
  rtb::Filter::multiply<double>(&local_2b8,(Polynomial<double> *)local_140,&local_2e0);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_2b8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_2b8);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_2e0);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Complex Multiplication");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"p1 * (2 + 2i) = ");
  std::complex<double>::complex(&local_368,2.0,2.0);
  local_358._M_array = &local_368;
  local_358._M_len = 1;
  rtb::Filter::Polynomial<double>::Polynomial(&local_348,&local_358);
  rtb::Filter::multiply<double>(&local_320,(Polynomial<double> *)local_38,&local_348);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_320);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_320);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_348);
  poVar4 = std::operator<<((ostream *)&std::cout,"p2 * (3 - 3i) = ");
  std::complex<double>::complex(&local_3d8,3.0,-3.0);
  local_3c8._M_array = &local_3d8;
  local_3c8._M_len = 1;
  rtb::Filter::Polynomial<double>::Polynomial(&local_3b8,&local_3c8);
  rtb::Filter::multiply<double>(&local_390,(Polynomial<double> *)local_80,&local_3b8);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_390);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_390);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_3b8);
  poVar4 = std::operator<<((ostream *)&std::cout,"p3 * (4 + 4i) = ");
  std::complex<double>::complex(&local_448,4.0,4.0);
  local_438._M_array = &local_448;
  local_438._M_len = 1;
  rtb::Filter::Polynomial<double>::Polynomial(&local_428,&local_438);
  rtb::Filter::multiply<double>(&local_400,(Polynomial<double> *)local_e0,&local_428);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_400);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_400);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_428);
  poVar4 = std::operator<<((ostream *)&std::cout,"p4 * (5 - 5i) = ");
  std::complex<double>::complex(&local_4b8,5.0,-5.0);
  local_4a8._M_array = &local_4b8;
  local_4a8._M_len = 1;
  rtb::Filter::Polynomial<double>::Polynomial(&local_498,&local_4a8);
  rtb::Filter::multiply<double>(&local_470,(Polynomial<double> *)local_140,&local_498);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_470);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_470);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_498);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Polynomial Multiplication");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"p1 * p1 = ");
  rtb::Filter::Polynomial<double>::operator*
            (&local_4e0,(Polynomial<double> *)local_38,(Polynomial<double> *)local_38);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_4e0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_4e0);
  poVar4 = std::operator<<((ostream *)&std::cout,"p2 * p1 = ");
  rtb::Filter::Polynomial<double>::operator*
            (&local_508,(Polynomial<double> *)local_80,(Polynomial<double> *)local_38);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_508);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_508);
  poVar4 = std::operator<<((ostream *)&std::cout,"p3 * p1 = ");
  rtb::Filter::Polynomial<double>::operator*
            (&local_530,(Polynomial<double> *)local_e0,(Polynomial<double> *)local_38);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_530);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_530);
  poVar4 = std::operator<<((ostream *)&std::cout,"p4 * p1 = ");
  rtb::Filter::Polynomial<double>::operator*
            (&local_558,(Polynomial<double> *)local_140,(Polynomial<double> *)local_38);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_558);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_558);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Polynomial Addition");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"p1 + p1 = ");
  rtb::Filter::add<double>(&local_580,(Polynomial<double> *)local_38,(Polynomial<double> *)local_38)
  ;
  poVar4 = rtb::Filter::operator<<(poVar4,&local_580);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_580);
  poVar4 = std::operator<<((ostream *)&std::cout,"p2 + p1 = ");
  rtb::Filter::add<double>(&local_5a8,(Polynomial<double> *)local_80,(Polynomial<double> *)local_38)
  ;
  poVar4 = rtb::Filter::operator<<(poVar4,&local_5a8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_5a8);
  poVar4 = std::operator<<((ostream *)&std::cout,"p3 + p1 = ");
  rtb::Filter::add<double>(&local_5d0,(Polynomial<double> *)local_e0,(Polynomial<double> *)local_38)
  ;
  poVar4 = rtb::Filter::operator<<(poVar4,&local_5d0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_5d0);
  poVar4 = std::operator<<((ostream *)&std::cout,"p4 + p1 = ");
  rtb::Filter::add<double>
            (&local_5f8,(Polynomial<double> *)local_140,(Polynomial<double> *)local_38);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_5f8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_5f8);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|        TEST #2         |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|    TransferFunction    |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Coefficients are normalised to the denominator");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Pole-zero simplifications are NOT implemented");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"TF = p1/p2 ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::TransferFunction<double>::TransferFunction
            (&local_650,(Polynomial<double> *)local_38,(Polynomial<double> *)local_80);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_650);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::TransferFunction<double>::~TransferFunction(&local_650);
  poVar4 = std::operator<<((ostream *)&std::cout,"TF = p2/p2 ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::TransferFunction<double>::TransferFunction
            (&local_6a8,(Polynomial<double> *)local_80,(Polynomial<double> *)local_80);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_6a8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::TransferFunction<double>::~TransferFunction(&local_6a8);
  poVar4 = std::operator<<((ostream *)&std::cout,"TF = p3/p2 ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::TransferFunction<double>::TransferFunction
            (&local_700,(Polynomial<double> *)local_e0,(Polynomial<double> *)local_80);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_700);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::TransferFunction<double>::~TransferFunction(&local_700);
  poVar4 = std::operator<<((ostream *)&std::cout,"TF = p4/p3 ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::TransferFunction<double>::TransferFunction
            (&local_758,(Polynomial<double> *)local_140,(Polynomial<double> *)local_e0);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_758);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::TransferFunction<double>::~TransferFunction(&local_758);
  poVar4 = std::operator<<((ostream *)&std::cout,"TF = p3/p4 ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::TransferFunction<double>::TransferFunction
            (&local_7b0,(Polynomial<double> *)local_e0,(Polynomial<double> *)local_140);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_7b0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::TransferFunction<double>::~TransferFunction(&local_7b0);
  poVar4 = std::operator<<((ostream *)&std::cout,"TF = (1+2i)/p2 ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::complex<double>::complex((complex<double> *)&lowPass2nd.denominator_.size_,1.0,2.0);
  local_840._M_array = (iterator)&lowPass2nd.denominator_.size_;
  local_840._M_len = 1;
  rtb::Filter::Polynomial<double>::Polynomial(&local_830,&local_840);
  rtb::Filter::TransferFunction<double>::TransferFunction
            (&local_808,&local_830,(Polynomial<double> *)local_80);
  poVar4 = rtb::Filter::operator<<(poVar4,&local_808);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::TransferFunction<double>::~TransferFunction(&local_808);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_830);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|        TEST #3         |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|    Filter Designer     |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::butter<double>((TransferFunction<double> *)local_8a8,2,6.0,1000.0);
  rtb::Filter::operator<<((ostream *)&std::cout,(TransferFunction<double> *)local_8a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_8c8,"lowPass2nd_bode.csv",(allocator *)((long)&lowPass6th.denominator_.size_ + 7)
            );
  bodeDiagram<double>((TransferFunction<double> *)local_8a8,(string *)local_8c8);
  std::__cxx11::string::~string(local_8c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&lowPass6th.denominator_.size_ + 7));
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::butter<double>((TransferFunction<double> *)local_928,6,300.0,1000.0);
  rtb::Filter::operator<<((ostream *)&std::cout,(TransferFunction<double> *)local_928);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_948,"lowPass6th_bode.csv",(allocator *)((long)&filterLowPass2nd.m_ + 7));
  bodeDiagram<double>((TransferFunction<double> *)local_928,(string *)local_948);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator((allocator<char> *)((long)&filterLowPass2nd.m_ + 7));
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|        TEST #4         |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|     Step Response      |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Filter<double>::Filter
            ((Filter<double> *)local_9f0,(TransferFunction<double> *)local_8a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a10,"lowPass2nd_step.csv",(allocator *)((long)&filterLowPass6th.m_ + 7));
  stepResponse<double>((Filter<double> *)local_9f0,(string *)local_a10);
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator((allocator<char> *)((long)&filterLowPass6th.m_ + 7));
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Filter<double>::Filter
            ((Filter<double> *)local_ab8,(TransferFunction<double> *)local_928);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ad8,"lowPass6th_step.csv",
             (allocator *)((long)&ssFilter.lastSecondDerivative_ + 7));
  stepResponse<double>((Filter<double> *)local_ab8,(string *)local_ad8);
  std::__cxx11::string::~string(local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ssFilter.lastSecondDerivative_ + 7));
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  rtb::Filter::StateSpaceFilter<double>::StateSpaceFilter
            ((StateSpaceFilter<double> *)
             &times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_b88[10] = 0.119;
  local_b88[0xb] = 0.14;
  local_b88[8] = 0.102;
  local_b88[9] = 0.11;
  local_b88[6] = 0.07;
  local_b88[7] = 0.09;
  local_b88[4] = 0.05;
  local_b88[5] = 0.063;
  local_b88[2] = 0.032;
  local_b88[3] = 0.038;
  local_b88[0] = 0.01;
  local_b88[1] = 0.02;
  local_b28 = local_b88;
  local_b20 = 0xc;
  std::allocator<double>::allocator(&local_b89);
  __l._M_len = local_b20;
  __l._M_array = local_b28;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_b18,__l,&local_b89);
  std::allocator<double>::~allocator(&local_b89);
  std::ofstream::ofstream(&__range1,"stateSpaceFilter_300_step.csv",0x10);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Printing step response to stateSpaceFilter_300_step.csv");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<(&__range1,0.0);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0.0);
  poVar4 = std::operator<<(poVar4,", ");
  dVar2 = rtb::Filter::StateSpaceFilter<double>::filter
                    ((StateSpaceFilter<double> *)
                     &times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0.0,0.0,300.0);
  pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar2);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_b18);
  t = (double)std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)local_b18);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&t);
    if (!bVar3) break;
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    emptyFilter.m_ = (size_t)*pdVar6;
    poVar4 = (ostream *)std::ostream::operator<<(&__range1,(double)emptyFilter.m_);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,1.0);
    poVar4 = std::operator<<(poVar4,", ");
    dVar2 = rtb::Filter::StateSpaceFilter<double>::filter
                      ((StateSpaceFilter<double> *)
                       &times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,1.0,(double)emptyFilter.m_,300.0);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar2);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  std::ofstream::close();
  poVar4 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|        TEST #5         |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|Filter def. constructor |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"--------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::Filter<double>::Filter((Filter<double> *)local_e50);
  rtb::Filter::Filter<double>::setTransferFunction
            ((Filter<double> *)local_e50,(TransferFunction<double> *)local_8a8);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Late initialization. IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e70,"lowPass2nd_step_lateInit.csv",
             (allocator *)((long)&ssfiler.lastSecondDerivative_ + 7));
  stepResponse<double>((Filter<double> *)local_e50,(string *)local_e70);
  std::__cxx11::string::~string(local_e70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ssfiler.lastSecondDerivative_ + 7));
  poVar4 = std::operator<<((ostream *)&std::cout,"Step response for state space filter with f0=8Hz")
  ;
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  rtb::Filter::StateSpaceFilter<double>::StateSpaceFilter((StateSpaceFilter<double> *)local_e98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_eb8,"ssfilter8Hz_step.csv",
             (allocator *)
             ((long)&bMa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  stepResponse<double>
            ((StateSpaceFilter<double> *)
             &times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,8.0,(string *)local_eb8);
  std::__cxx11::string::~string(local_eb8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bMa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  poVar4 = std::operator<<((ostream *)&std::cout,"Step response for moving average filter");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_ee0 = 0.05;
  paVar1 = (allocator<double> *)
           ((long)&aMa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_ed8,0x14,&local_ee0,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&aMa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_f08 = 1.0;
  paVar1 = (allocator<double> *)((long)&maFilter.m_ + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_f00,1,&local_f08,paVar1);
  std::allocator<double>::~allocator((allocator<double> *)((long)&maFilter.m_ + 7));
  rtb::Filter::Polynomial<double>::Polynomial
            (&local_1030,(vector<double,_std::allocator<double>_> *)local_ed8);
  rtb::Filter::Polynomial<double>::Polynomial
            (&local_1058,(vector<double,_std::allocator<double>_> *)local_f00);
  rtb::Filter::TransferFunction<double>::TransferFunction(&local_1008,&local_1030,&local_1058);
  rtb::Filter::Filter<double>::Filter((Filter<double> *)local_fb0,&local_1008);
  rtb::Filter::TransferFunction<double>::~TransferFunction(&local_1008);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_1058);
  rtb::Filter::Polynomial<double>::~Polynomial(&local_1030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1078,"moving_avg_filter_step.csv",&local_1079);
  stepResponse<double>((Filter<double> *)local_fb0,(string *)local_1078);
  std::__cxx11::string::~string(local_1078);
  std::allocator<char>::~allocator((allocator<char> *)&local_1079);
  exit(0);
}

Assistant:

int main() {

    typedef std::complex<double> Complex;
    cout << "--------------------------" << endl;
    cout << "|        TEST #1         |" << endl;
    cout << "|       Polynomial       |" << endl;
    cout << "--------------------------" << endl;

    Polynomial<double> p1{ 1, 2 };
    Polynomial<double> p2{ 1, -2, 0 };
    Polynomial<double> p3{ 0, 2, 3, 4 };
    Polynomial<double> p4{ 5 };

    cout << "p1 =" << p1;
    cout << "p2 =" << p2;
    cout << "p3 =" << p3;
    cout << "p4 =" << p4;
    cout << endl;
    cout << "Scalar Multiplication" << endl;
    cout << "p1 * 2 = " << multiply<double>(p1, { 2 }) << endl;
    cout << "p2 * 3 = " << multiply<double>(p2, { 3 }) << endl;
    cout << "p3 * 4 = " << multiply<double>(p3, { 4 }) << endl;
    cout << "p4 * 5 = " << multiply<double>(p4, { 5 }) << endl;
    cout << endl;
    cout << "Complex Multiplication" << endl;
    cout << "p1 * (2 + 2i) = " << multiply<double>(p1, { Complex(2, 2) }) << endl;
    cout << "p2 * (3 - 3i) = " << multiply<double>(p2, { Complex(3, -3) }) << endl;
    cout << "p3 * (4 + 4i) = " << multiply<double>(p3, { Complex(4, 4) }) << endl;
    cout << "p4 * (5 - 5i) = " << multiply<double>(p4, { Complex(5, -5) }) << endl;
    cout << endl;
    cout << "Polynomial Multiplication" << endl;
    cout << "p1 * p1 = " << p1*p1 << endl;
    cout << "p2 * p1 = " << p2*p1 << endl;
    cout << "p3 * p1 = " << p3*p1 << endl;
    cout << "p4 * p1 = " << p4*p1 << endl;
    cout << endl;
    cout << "Polynomial Addition" << endl;
    cout << "p1 + p1 = " << add<double>(p1, p1) << endl;
    cout << "p2 + p1 = " << add<double>(p2, p1) << endl;
    cout << "p3 + p1 = " << add<double>(p3, p1) << endl;
    cout << "p4 + p1 = " << add<double>(p4, p1) << endl;
    cout << endl;

    cout << "--------------------------" << endl;
    cout << "|        TEST #2         |" << endl;
    cout << "|    TransferFunction    |" << endl;
    cout << "--------------------------" << endl;
    cout << "Coefficients are normalised to the denominator" << endl;
    cout << "Pole-zero simplifications are NOT implemented" << endl;
    cout << "TF = p1/p2 " << endl << TransferFunction<double>(p1, p2) << endl;
    cout << "TF = p2/p2 " << endl << TransferFunction<double>(p2, p2) << endl;
    cout << "TF = p3/p2 " << endl << TransferFunction<double>(p3, p2) << endl;
    cout << "TF = p4/p3 " << endl << TransferFunction<double>(p4, p3) << endl;
    cout << "TF = p3/p4 " << endl << TransferFunction<double>(p3, p4) << endl;
    cout << "TF = (1+2i)/p2 " << endl << TransferFunction<double>({ { 1, 2 } }, p2) << endl;
    cout << endl;

    cout << "--------------------------" << endl;
    cout << "|        TEST #3         |" << endl;
    cout << "|    Filter Designer     |" << endl;
    cout << "--------------------------" << endl;
    cout << "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz" << endl;
    TransferFunction<double> lowPass2nd(butter<double>(2, 6, 1000));
    cout << lowPass2nd;
    bodeDiagram(lowPass2nd, "lowPass2nd_bode.csv");
    cout << endl;

    cout << "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz" << endl;
    TransferFunction<double> lowPass6th(butter<double>(6, 300, 1000));
    cout << lowPass6th;
    bodeDiagram(lowPass6th, "lowPass6th_bode.csv");
    cout << endl;

    cout << "--------------------------" << endl;
    cout << "|        TEST #4         |" << endl;
    cout << "|     Step Response      |" << endl;
    cout << "--------------------------" << endl;

    cout << "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz" << endl;
    Filter<double> filterLowPass2nd(lowPass2nd);
    stepResponse<double>(filterLowPass2nd, "lowPass2nd_step.csv");
    cout << endl;
    cout << "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz" << endl;
    Filter<double> filterLowPass6th(lowPass6th);
    stepResponse<double>(filterLowPass6th, "lowPass6th_step.csv");
    cout << endl;

    StateSpaceFilter<double> ssFilter;
    std::vector<double> times = { 0.01, 0.02, 0.032, 0.038, 0.05, 0.063, 0.07, 0.09, 0.102, 0.11, 0.119, 0.14 };
    std::ofstream outF("stateSpaceFilter_300_step.csv");
    cout << "Printing step response to stateSpaceFilter_300_step.csv" << endl;
    outF << 0.0 << ", " << 0.0 << ", " << ssFilter.filter(0.0, 0.0, 300) << std::endl;
    for (auto t : times)
        outF << t << ", " << 1.0 << ", " << ssFilter.filter(1.0, t, 300) << std::endl;
    outF.close();

    cout << "--------------------------" << endl;
    cout << "|        TEST #5         |" << endl;
    cout << "|Filter def. constructor |" << endl;
    cout << "--------------------------" << endl;

    Filter<double> emptyFilter;
    emptyFilter.setTransferFunction(lowPass2nd);
    cout << "Late initialization. IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz" << endl;
    stepResponse<double>(emptyFilter, "lowPass2nd_step_lateInit.csv");

    cout << "Step response for state space filter with f0=8Hz" << endl;
    StateSpaceFilter<double> ssfiler;
    stepResponse<double>(ssFilter, 8, "ssfilter8Hz_step.csv");

    cout << "Step response for moving average filter" << endl;
    std::vector<double> bMa(20, 1. / 20.);
    std::vector<double> aMa(1, 1.);

    Filter<double> maFilter(TransferFunction<>(bMa, aMa));
    stepResponse<double>(maFilter, "moving_avg_filter_step.csv");

    /*
    std::cout << "p1 = " << p1;
    std::cout << "p1(3) = " << p1.solveFor(-1) << std::endl;

    //step response
    std::vector<double> zeroes(1, 0.0);
    std::vector<double> ones(1000, 1.0);
    std::vector<double> step(zeroes);
    step.insert(step.end(), ones.begin(), ones.end());

    TransferFunction<double> tfDesigned(Designer::butter2ndOrder<double>(6, 1000.));

    std::cout << "Designed filter\n";
    std::cout << tfDesigned.getSamplingFrequency() << std::endl;
    Filter<double> filter(tfDesigned);

    Filter<double> filter4th(Designer::butter<double>(4, 6, 1000));

    //std::cout << filter;
    //std::cout << filter4th;
    //      std::cout << filterDouble;

    /*
    std::ofstream oF("output.csv");
    for (double val : step)
    oF << val << "," << std::abs(filter.filter(val)) << "," << std::abs(filter4th.filter(val)) << std::endl;
    oF.close();

    std::ofstream oFBode("bode_gain.csv");
    std::vector<double> xValues, gain, phase;
    tfDesigned.getBode(xValues, gain, phase);
    for (unsigned i{ 0 }; i < xValues.size(); ++i)
    oFBode << xValues.at(i) << "," << gain.at(i) << "," << phase.at(i) << std::endl;
    oFBode.close();
    /*
    std::ofstream oFBodePhase("bode_phase.csv");
    for (unsigned i{ 1 }; i < 1000; ++i)
    oFBodePhase << M_PI / 1000 * i << "," << tfDesigned.getPhaseAt(M_PI / 1000 * i) << std::endl;
    oFBodePhase.close();

    /*

    //test filtfilt
    vector<double> firstPass(filter.pass(step));
    std::reverse(firstPass.begin(), firstPass.end());
    vector<double> secondPass(filter.pass(firstPass));
    std::reverse(secondPass.begin(), secondPass.end());

    std::reverse(firstPass.begin(), firstPass.end());

    std::ofstream oF2("filtfilt.csv");
    for (unsigned i{ 0 }; i < step.size(); ++i)
    oF2 << step.at(i) << "," << firstPass.at(i) << "," << secondPass.at(i) << std::endl;
    oF2.close();

    /*

    //test linear phase fir filter
    std::vector<double> firB( {
    0.00127199776427371,
    0.00175973248875467,
    -0.000474050123699974,
    -0.00507655778150986,
    -0.00730622779100510,
    -0.00139834985893385,
    0.0118182305510141,
    0.0208600394665444,
    0.0108509633977398,
    -0.0201948738097724,
    -0.0503421398292688,
    -0.0426075899832280,
    0.0273002961309331,
    0.144919701151270,
    0.257048286517307,
    0.303233271924363,
    0.257048286517307,
    0.144919701151270,
    0.0273002961309331,
    -0.0426075899832280,
    -0.0503421398292688,
    -0.0201948738097724,
    0.0108509633977398,
    0.0208600394665444,
    0.0118182305510141,
    -0.00139834985893385,
    -0.00730622779100510,
    -0.00507655778150986,
    -0.000474050123699974,
    0.00175973248875467,
    0.00127199776427371
    } );

    Polynomial<> n(firB), d{ 1 };

    TransferFunction<> tfFir(n, d);
    Filter<> firFilter(tfFir);
    vector<double> resultFir(firFilter.pass(step));

    std::ofstream oF3("comparison.csv");
    for (unsigned i{ 0 }; i < step.size(); ++i)
    oF3 << step.at(i) << "," << firstPass.at(i) << "," << secondPass.at(i) << ", " << resultFir.at(i) << std::endl;
    oF3.close();

    */
    //      TransferFunction<double> h1(p1, p2);

    //std::cout << add(p, Polynomial<double>(std::vector<double>{ 1, 2, 3, 4 }));

    std::exit(EXIT_SUCCESS);
}